

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clparser_test.cc
# Opt level: O2

void __thiscall CLParserTestShowIncludes::Run(CLParserTestShowIncludes *this)

{
  Test *pTVar1;
  bool bVar2;
  allocator<char> local_7a;
  allocator<char> local_79;
  string local_78;
  string local_58;
  string local_38;
  
  pTVar1 = g_current_test;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"",&local_79);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"",&local_7a);
  CLParser::FilterShowIncludes(&local_38,&local_58,&local_78);
  bVar2 = std::operator==("",&local_38);
  bVar2 = testing::Test::Check
                    (pTVar1,bVar2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clparser_test.cc"
                     ,0x17,"\"\" == CLParser::FilterShowIncludes(\"\", \"\")");
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  pTVar1 = g_current_test;
  if (bVar2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"Sample compiler output",&local_79);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"",&local_7a);
    CLParser::FilterShowIncludes(&local_38,&local_58,&local_78);
    bVar2 = std::operator==("",&local_38);
    bVar2 = testing::Test::Check
                      (pTVar1,bVar2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clparser_test.cc"
                       ,0x19,
                       "\"\" == CLParser::FilterShowIncludes(\"Sample compiler output\", \"\")");
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
    pTVar1 = g_current_test;
    if (bVar2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_58,"Note: including file: c:\\Some Files\\foobar.h",&local_79);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"",&local_7a);
      CLParser::FilterShowIncludes(&local_38,&local_58,&local_78);
      bVar2 = std::operator==("c:\\Some Files\\foobar.h",&local_38);
      bVar2 = testing::Test::Check
                        (pTVar1,bVar2,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clparser_test.cc"
                         ,0x1c,
                         "\"c:\\\\Some Files\\\\foobar.h\" == CLParser::FilterShowIncludes(\"Note: including file: \" \"c:\\\\Some Files\\\\foobar.h\", \"\")"
                        );
      std::__cxx11::string::~string((string *)&local_38);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_58);
      pTVar1 = g_current_test;
      if (bVar2) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_58,"Note: including file:    c:\\initspaces.h",&local_79);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"",&local_7a);
        CLParser::FilterShowIncludes(&local_38,&local_58,&local_78);
        bVar2 = std::operator==("c:\\initspaces.h",&local_38);
        bVar2 = testing::Test::Check
                          (pTVar1,bVar2,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clparser_test.cc"
                           ,0x1f,
                           "\"c:\\\\initspaces.h\" == CLParser::FilterShowIncludes(\"Note: including file:    \" \"c:\\\\initspaces.h\", \"\")"
                          );
        std::__cxx11::string::~string((string *)&local_38);
        std::__cxx11::string::~string((string *)&local_78);
        std::__cxx11::string::~string((string *)&local_58);
        pTVar1 = g_current_test;
        if (bVar2) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_58,"Non-default prefix: inc file:    c:\\initspaces.h",
                     &local_79);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_78,"Non-default prefix: inc file:",&local_7a);
          CLParser::FilterShowIncludes(&local_38,&local_58,&local_78);
          bVar2 = std::operator==("c:\\initspaces.h",&local_38);
          bVar2 = testing::Test::Check
                            (pTVar1,bVar2,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clparser_test.cc"
                             ,0x23,
                             "\"c:\\\\initspaces.h\" == CLParser::FilterShowIncludes(\"Non-default prefix: inc file:    \" \"c:\\\\initspaces.h\", \"Non-default prefix: inc file:\")"
                            );
          std::__cxx11::string::~string((string *)&local_38);
          std::__cxx11::string::~string((string *)&local_78);
          std::__cxx11::string::~string((string *)&local_58);
          if (bVar2) {
            return;
          }
        }
      }
    }
  }
  g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  return;
}

Assistant:

TEST(CLParserTest, ShowIncludes) {
  ASSERT_EQ("", CLParser::FilterShowIncludes("", ""));

  ASSERT_EQ("", CLParser::FilterShowIncludes("Sample compiler output", ""));
  ASSERT_EQ("c:\\Some Files\\foobar.h",
            CLParser::FilterShowIncludes("Note: including file: "
                                         "c:\\Some Files\\foobar.h", ""));
  ASSERT_EQ("c:\\initspaces.h",
            CLParser::FilterShowIncludes("Note: including file:    "
                                         "c:\\initspaces.h", ""));
  ASSERT_EQ("c:\\initspaces.h",
            CLParser::FilterShowIncludes("Non-default prefix: inc file:    "
                                         "c:\\initspaces.h",
                    "Non-default prefix: inc file:"));
}